

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O1

int uv_set_process_title(char *title)

{
  char *title_00;
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  size_t __n;
  
  if (args_mem == (void *)0x0) {
    iVar3 = -0x69;
  }
  else {
    sVar2 = strlen(title);
    uv_once(&process_title_mutex_once,init_process_title_mutex_once);
    uv_mutex_lock(&process_title_mutex);
    uVar1 = process_title_2;
    title_00 = process_title_0;
    iVar3 = 0;
    __n = 0;
    if (process_title_2 != 0) {
      __n = process_title_2 - 1;
    }
    if (sVar2 < process_title_2) {
      __n = sVar2;
    }
    memcpy(process_title_0,title,__n);
    memset(title_00 + __n,0,uVar1 - __n);
    process_title_1 = __n;
    uv__set_process_title(title_00);
    uv_mutex_unlock(&process_title_mutex);
  }
  return iVar3;
}

Assistant:

int uv_set_process_title(const char* title) {
  struct uv__process_title* pt;
  size_t len;

  /* If uv_setup_args wasn't called or failed, we can't continue. */
  if (args_mem == NULL)
    return UV_ENOBUFS;

  pt = &process_title;
  len = strlen(title);

  uv_once(&process_title_mutex_once, init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);

  if (len >= pt->cap) {
    len = 0;
    if (pt->cap > 0)
      len = pt->cap - 1;
  }

  memcpy(pt->str, title, len);
  memset(pt->str + len, '\0', pt->cap - len);
  pt->len = len;
  uv__set_process_title(pt->str);

  uv_mutex_unlock(&process_title_mutex);

  return 0;
}